

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_31287a::Handlers::beginOverlay(Handlers *this,JSON *j)

{
  shared_ptr<QPDFJob::UOConfig> local_28;
  JSON *local_18;
  JSON *j_local;
  Handlers *this_local;
  
  local_18 = j;
  j_local = (JSON *)this;
  std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->c_main);
  QPDFJob::Config::overlay((Config *)&local_28);
  std::shared_ptr<QPDFJob::UOConfig>::operator=(&this->c_uo,&local_28);
  std::shared_ptr<QPDFJob::UOConfig>::~shared_ptr(&local_28);
  beginUnderOverlay(this,j);
  return;
}

Assistant:

void
Handlers::beginOverlay(JSON j)
{
    this->c_uo = c_main->overlay();
    beginUnderOverlay(j);
}